

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O3

VkFormat vk::mapTextureFormat(TextureFormat *format)

{
  ChannelType CVar1;
  VkFormat VVar2;
  InternalError *this;
  
  CVar1 = format->order << 0x10 | format->type;
  if (0x7ffff < (int)CVar1) {
    if ((int)CVar1 < 0xa001e) {
      if ((int)CVar1 < 0x9000c) {
        switch(CVar1) {
        case 0x80000:
          return VK_FORMAT_R8G8B8A8_SNORM;
        case 0x80001:
          return VK_FORMAT_R16G16B16A16_SNORM;
        case 0x80003:
          return VK_FORMAT_R8G8B8A8_UNORM;
        case 0x80004:
          return VK_FORMAT_R16G16B16A16_UNORM;
        case 0x8000a:
          return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
        case 0x8000b:
          return VK_FORMAT_R5G5B5A1_UNORM_PACK16;
        case 0x8000e:
          return VK_FORMAT_A2B10G10R10_SNORM_PACK32;
        case 0x8000f:
          return VK_FORMAT_A2B10G10R10_UNORM_PACK32;
        case 0x80014:
          return VK_FORMAT_A2B10G10R10_SINT_PACK32;
        case 0x80015:
          return VK_FORMAT_A2B10G10R10_UINT_PACK32;
        case 0x8001b:
          return VK_FORMAT_R8G8B8A8_SINT;
        case 0x8001c:
          return VK_FORMAT_R16G16B16A16_SINT;
        case 0x8001d:
          return VK_FORMAT_R32G32B32A32_SINT;
        case 0x8001e:
          return VK_FORMAT_R8G8B8A8_UINT;
        case 0x8001f:
          return VK_FORMAT_R16G16B16A16_UINT;
        case 0x80021:
          return VK_FORMAT_R32G32B32A32_UINT;
        case 0x80022:
          return VK_FORMAT_R16G16B16A16_SFLOAT;
        case 0x80023:
          return VK_FORMAT_R32G32B32A32_SFLOAT;
        case 0x80024:
          return VK_FORMAT_R64G64B64A64_SFLOAT;
        }
      }
      else if ((int)CVar1 < 0xa0003) {
        if (CVar1 == 0x9000c) {
          return VK_FORMAT_A1R5G5B5_UNORM_PACK16;
        }
        if (CVar1 == 0xa0000) {
          return VK_FORMAT_B8G8R8_SNORM;
        }
      }
      else {
        if (CVar1 == 0xa0003) {
          return VK_FORMAT_B8G8R8_UNORM;
        }
        if (CVar1 == 0xa0008) {
          return VK_FORMAT_B5G6R5_UNORM_PACK16;
        }
        if (CVar1 == 0xa001b) {
          return VK_FORMAT_B8G8R8_SINT;
        }
      }
    }
    else if ((int)CVar1 < 0xd0003) {
      if ((int)CVar1 < 0xb000a) {
        if (CVar1 == 0xa001e) {
          return VK_FORMAT_B8G8R8_UINT;
        }
        if (CVar1 == 0xb0000) {
          return VK_FORMAT_B8G8R8A8_SNORM;
        }
        if (CVar1 == 0xb0003) {
          return VK_FORMAT_B8G8R8A8_UNORM;
        }
      }
      else if ((int)CVar1 < 0xb001b) {
        switch(CVar1) {
        case 0xb000a:
          return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
        case 0xb000b:
          return VK_FORMAT_B5G5R5A1_UNORM_PACK16;
        case 0xb000e:
          return VK_FORMAT_A2R10G10B10_SNORM_PACK32;
        case 0xb000f:
          return VK_FORMAT_A2R10G10B10_UNORM_PACK32;
        case 0xb0014:
          return VK_FORMAT_A2R10G10B10_SINT_PACK32;
        case 0xb0015:
          return VK_FORMAT_A2R10G10B10_UINT_PACK32;
        }
      }
      else {
        if (CVar1 == 0xb001b) {
          return VK_FORMAT_B8G8R8A8_SINT;
        }
        if (CVar1 == 0xb001e) {
          return VK_FORMAT_B8G8R8A8_UINT;
        }
        if (CVar1 == 0xc0003) {
          return VK_FORMAT_R8_SRGB;
        }
      }
    }
    else if ((int)CVar1 < 0x12001a) {
      if ((int)CVar1 < 0x100003) {
        if (CVar1 == 0xd0003) {
          return VK_FORMAT_R8G8_SRGB;
        }
        if (CVar1 == 0xe0003) {
          return VK_FORMAT_R8G8B8_SRGB;
        }
        if (CVar1 == 0xf0003) {
          return VK_FORMAT_R8G8B8A8_SRGB;
        }
      }
      else {
        if (CVar1 == 0x100003) {
          return VK_FORMAT_B8G8R8_SRGB;
        }
        if (CVar1 == 0x110003) {
          return VK_FORMAT_B8G8R8A8_SRGB;
        }
        if (CVar1 == 0x120004) {
          return VK_FORMAT_D16_UNORM;
        }
      }
    }
    else if ((int)CVar1 < 0x140018) {
      if (CVar1 == 0x12001a) {
        return VK_FORMAT_X8_D24_UNORM_PACK32;
      }
      if (CVar1 == 0x120023) {
        return VK_FORMAT_D32_SFLOAT;
      }
      if (CVar1 == 0x13001e) {
        return VK_FORMAT_S8_UINT;
      }
    }
    else {
      if (CVar1 == 0x140018) {
        return VK_FORMAT_D16_UNORM_S8_UINT;
      }
      if (CVar1 == 0x14001a) {
        return VK_FORMAT_D24_UNORM_S8_UINT;
      }
      if (CVar1 == 0x140025) {
        return VK_FORMAT_D32_SFLOAT_S8_UINT;
      }
    }
    goto switchD_00a0f0bf_caseD_80002;
  }
  if ((int)CVar1 < 0x5001b) {
    switch(CVar1) {
    case SIGNED_INT8:
      VVar2 = VK_FORMAT_R8_SINT;
      break;
    case SIGNED_INT16:
      VVar2 = VK_FORMAT_R16_SINT;
      break;
    case SIGNED_INT32:
      VVar2 = VK_FORMAT_R32_SINT;
      break;
    case UNSIGNED_INT8:
      VVar2 = VK_FORMAT_R8_UINT;
      break;
    case UNSIGNED_INT16:
      VVar2 = VK_FORMAT_R16_UINT;
      break;
    case UNSIGNED_INT24:
      goto switchD_00a0f0bf_caseD_80002;
    case UNSIGNED_INT32:
      VVar2 = VK_FORMAT_R32_UINT;
      break;
    case HALF_FLOAT:
      VVar2 = VK_FORMAT_R16_SFLOAT;
      break;
    case FLOAT:
      VVar2 = VK_FORMAT_R32_SFLOAT;
      break;
    case FLOAT64:
      VVar2 = VK_FORMAT_R64_SFLOAT;
      break;
    default:
      switch(CVar1) {
      case 0x50000:
        VVar2 = VK_FORMAT_R8G8_SNORM;
        break;
      case 0x50001:
        VVar2 = VK_FORMAT_R16G16_SNORM;
        break;
      case 0x50002:
      case 0x50005:
      case 0x50006:
        goto switchD_00a0f0bf_caseD_80002;
      case 0x50003:
        VVar2 = VK_FORMAT_R8G8_UNORM;
        break;
      case 0x50004:
        VVar2 = VK_FORMAT_R16G16_UNORM;
        break;
      case 0x50007:
        VVar2 = VK_FORMAT_R4G4_UNORM_PACK8;
        break;
      default:
        switch(CVar1) {
        case SNORM_INT8:
          VVar2 = VK_FORMAT_R8_SNORM;
          break;
        case SNORM_INT16:
          VVar2 = VK_FORMAT_R16_SNORM;
          break;
        default:
          goto switchD_00a0f0bf_caseD_80002;
        case UNORM_INT8:
          VVar2 = VK_FORMAT_R8_UNORM;
          break;
        case UNORM_INT16:
          VVar2 = VK_FORMAT_R16_UNORM;
        }
      }
    }
  }
  else {
    switch(CVar1) {
    case 0x70000:
      VVar2 = VK_FORMAT_R8G8B8_SNORM;
      break;
    case 0x70001:
      VVar2 = VK_FORMAT_R16G16B16_SNORM;
      break;
    case 0x70002:
    case 0x70005:
    case 0x70006:
    case 0x70007:
    case 0x70009:
    case 0x7000a:
    case 0x7000b:
    case 0x7000c:
    case 0x7000d:
    case 0x7000e:
    case 0x7000f:
    case 0x70010:
    case 0x70011:
    case 0x70012:
    case 0x70013:
    case 0x70014:
    case 0x70015:
    case 0x70018:
    case 0x70019:
    case 0x7001a:
    case 0x70020:
switchD_00a0f0bf_caseD_80002:
      this = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this,"Unknown texture format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
                 ,0x14d);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    case 0x70003:
      VVar2 = VK_FORMAT_R8G8B8_UNORM;
      break;
    case 0x70004:
      VVar2 = VK_FORMAT_R16G16B16_UNORM;
      break;
    case 0x70008:
      VVar2 = VK_FORMAT_R5G6B5_UNORM_PACK16;
      break;
    case 0x70016:
      VVar2 = VK_FORMAT_B10G11R11_UFLOAT_PACK32;
      break;
    case 0x70017:
      VVar2 = VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
      break;
    case 0x7001b:
      VVar2 = VK_FORMAT_R8G8B8_SINT;
      break;
    case 0x7001c:
      VVar2 = VK_FORMAT_R16G16B16_SINT;
      break;
    case 0x7001d:
      VVar2 = VK_FORMAT_R32G32B32_SINT;
      break;
    case 0x7001e:
      VVar2 = VK_FORMAT_R8G8B8_UINT;
      break;
    case 0x7001f:
      VVar2 = VK_FORMAT_R16G16B16_UINT;
      break;
    case 0x70021:
      VVar2 = VK_FORMAT_R32G32B32_UINT;
      break;
    case 0x70022:
      VVar2 = VK_FORMAT_R16G16B16_SFLOAT;
      break;
    case 0x70023:
      VVar2 = VK_FORMAT_R32G32B32_SFLOAT;
      break;
    case 0x70024:
      VVar2 = VK_FORMAT_R64G64B64_SFLOAT;
      break;
    default:
      switch(CVar1) {
      case 0x5001b:
        VVar2 = VK_FORMAT_R8G8_SINT;
        break;
      case 0x5001c:
        VVar2 = VK_FORMAT_R16G16_SINT;
        break;
      case 0x5001d:
        VVar2 = VK_FORMAT_R32G32_SINT;
        break;
      case 0x5001e:
        VVar2 = VK_FORMAT_R8G8_UINT;
        break;
      case 0x5001f:
        VVar2 = VK_FORMAT_R16G16_UINT;
        break;
      default:
        goto switchD_00a0f0bf_caseD_80002;
      case 0x50021:
        VVar2 = VK_FORMAT_R32G32_UINT;
        break;
      case 0x50022:
        VVar2 = VK_FORMAT_R16G16_SFLOAT;
        break;
      case 0x50023:
        VVar2 = VK_FORMAT_R32G32_SFLOAT;
        break;
      case 0x50024:
        VVar2 = VK_FORMAT_R64G64_SFLOAT;
      }
    }
  }
  return VVar2;
}

Assistant:

VkFormat mapTextureFormat (const tcu::TextureFormat& format)
{
	DE_STATIC_ASSERT(tcu::TextureFormat::CHANNELORDER_LAST < (1<<16));
	DE_STATIC_ASSERT(tcu::TextureFormat::CHANNELTYPE_LAST < (1<<16));

#define PACK_FMT(ORDER, TYPE) ((int(ORDER) << 16) | int(TYPE))
#define FMT_CASE(ORDER, TYPE) PACK_FMT(tcu::TextureFormat::ORDER, tcu::TextureFormat::TYPE)

	// update this mapping if VkFormat changes
	DE_STATIC_ASSERT(VK_CORE_FORMAT_LAST == 185);

	switch (PACK_FMT(format.order, format.type))
	{
		case FMT_CASE(RG, UNORM_BYTE_44):					return VK_FORMAT_R4G4_UNORM_PACK8;
		case FMT_CASE(RGB, UNORM_SHORT_565):				return VK_FORMAT_R5G6B5_UNORM_PACK16;
		case FMT_CASE(RGBA, UNORM_SHORT_4444):				return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
		case FMT_CASE(RGBA, UNORM_SHORT_5551):				return VK_FORMAT_R5G5B5A1_UNORM_PACK16;

		case FMT_CASE(BGR, UNORM_SHORT_565):				return VK_FORMAT_B5G6R5_UNORM_PACK16;
		case FMT_CASE(BGRA, UNORM_SHORT_4444):				return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
		case FMT_CASE(BGRA, UNORM_SHORT_5551):				return VK_FORMAT_B5G5R5A1_UNORM_PACK16;

		case FMT_CASE(ARGB, UNORM_SHORT_1555):				return VK_FORMAT_A1R5G5B5_UNORM_PACK16;

		case FMT_CASE(R, UNORM_INT8):						return VK_FORMAT_R8_UNORM;
		case FMT_CASE(R, SNORM_INT8):						return VK_FORMAT_R8_SNORM;
		case FMT_CASE(R, UNSIGNED_INT8):					return VK_FORMAT_R8_UINT;
		case FMT_CASE(R, SIGNED_INT8):						return VK_FORMAT_R8_SINT;
		case FMT_CASE(sR, UNORM_INT8):						return VK_FORMAT_R8_SRGB;

		case FMT_CASE(RG, UNORM_INT8):						return VK_FORMAT_R8G8_UNORM;
		case FMT_CASE(RG, SNORM_INT8):						return VK_FORMAT_R8G8_SNORM;
		case FMT_CASE(RG, UNSIGNED_INT8):					return VK_FORMAT_R8G8_UINT;
		case FMT_CASE(RG, SIGNED_INT8):						return VK_FORMAT_R8G8_SINT;
		case FMT_CASE(sRG, UNORM_INT8):						return VK_FORMAT_R8G8_SRGB;

		case FMT_CASE(RGB, UNORM_INT8):						return VK_FORMAT_R8G8B8_UNORM;
		case FMT_CASE(RGB, SNORM_INT8):						return VK_FORMAT_R8G8B8_SNORM;
		case FMT_CASE(RGB, UNSIGNED_INT8):					return VK_FORMAT_R8G8B8_UINT;
		case FMT_CASE(RGB, SIGNED_INT8):					return VK_FORMAT_R8G8B8_SINT;
		case FMT_CASE(sRGB, UNORM_INT8):					return VK_FORMAT_R8G8B8_SRGB;

		case FMT_CASE(RGBA, UNORM_INT8):					return VK_FORMAT_R8G8B8A8_UNORM;
		case FMT_CASE(RGBA, SNORM_INT8):					return VK_FORMAT_R8G8B8A8_SNORM;
		case FMT_CASE(RGBA, UNSIGNED_INT8):					return VK_FORMAT_R8G8B8A8_UINT;
		case FMT_CASE(RGBA, SIGNED_INT8):					return VK_FORMAT_R8G8B8A8_SINT;
		case FMT_CASE(sRGBA, UNORM_INT8):					return VK_FORMAT_R8G8B8A8_SRGB;

		case FMT_CASE(RGBA, UNORM_INT_1010102_REV):			return VK_FORMAT_A2B10G10R10_UNORM_PACK32;
		case FMT_CASE(RGBA, SNORM_INT_1010102_REV):			return VK_FORMAT_A2B10G10R10_SNORM_PACK32;
		case FMT_CASE(RGBA, UNSIGNED_INT_1010102_REV):		return VK_FORMAT_A2B10G10R10_UINT_PACK32;
		case FMT_CASE(RGBA, SIGNED_INT_1010102_REV):		return VK_FORMAT_A2B10G10R10_SINT_PACK32;

		case FMT_CASE(R, UNORM_INT16):						return VK_FORMAT_R16_UNORM;
		case FMT_CASE(R, SNORM_INT16):						return VK_FORMAT_R16_SNORM;
		case FMT_CASE(R, UNSIGNED_INT16):					return VK_FORMAT_R16_UINT;
		case FMT_CASE(R, SIGNED_INT16):						return VK_FORMAT_R16_SINT;
		case FMT_CASE(R, HALF_FLOAT):						return VK_FORMAT_R16_SFLOAT;

		case FMT_CASE(RG, UNORM_INT16):						return VK_FORMAT_R16G16_UNORM;
		case FMT_CASE(RG, SNORM_INT16):						return VK_FORMAT_R16G16_SNORM;
		case FMT_CASE(RG, UNSIGNED_INT16):					return VK_FORMAT_R16G16_UINT;
		case FMT_CASE(RG, SIGNED_INT16):					return VK_FORMAT_R16G16_SINT;
		case FMT_CASE(RG, HALF_FLOAT):						return VK_FORMAT_R16G16_SFLOAT;

		case FMT_CASE(RGB, UNORM_INT16):					return VK_FORMAT_R16G16B16_UNORM;
		case FMT_CASE(RGB, SNORM_INT16):					return VK_FORMAT_R16G16B16_SNORM;
		case FMT_CASE(RGB, UNSIGNED_INT16):					return VK_FORMAT_R16G16B16_UINT;
		case FMT_CASE(RGB, SIGNED_INT16):					return VK_FORMAT_R16G16B16_SINT;
		case FMT_CASE(RGB, HALF_FLOAT):						return VK_FORMAT_R16G16B16_SFLOAT;

		case FMT_CASE(RGBA, UNORM_INT16):					return VK_FORMAT_R16G16B16A16_UNORM;
		case FMT_CASE(RGBA, SNORM_INT16):					return VK_FORMAT_R16G16B16A16_SNORM;
		case FMT_CASE(RGBA, UNSIGNED_INT16):				return VK_FORMAT_R16G16B16A16_UINT;
		case FMT_CASE(RGBA, SIGNED_INT16):					return VK_FORMAT_R16G16B16A16_SINT;
		case FMT_CASE(RGBA, HALF_FLOAT):					return VK_FORMAT_R16G16B16A16_SFLOAT;

		case FMT_CASE(R, UNSIGNED_INT32):					return VK_FORMAT_R32_UINT;
		case FMT_CASE(R, SIGNED_INT32):						return VK_FORMAT_R32_SINT;
		case FMT_CASE(R, FLOAT):							return VK_FORMAT_R32_SFLOAT;

		case FMT_CASE(RG, UNSIGNED_INT32):					return VK_FORMAT_R32G32_UINT;
		case FMT_CASE(RG, SIGNED_INT32):					return VK_FORMAT_R32G32_SINT;
		case FMT_CASE(RG, FLOAT):							return VK_FORMAT_R32G32_SFLOAT;

		case FMT_CASE(RGB, UNSIGNED_INT32):					return VK_FORMAT_R32G32B32_UINT;
		case FMT_CASE(RGB, SIGNED_INT32):					return VK_FORMAT_R32G32B32_SINT;
		case FMT_CASE(RGB, FLOAT):							return VK_FORMAT_R32G32B32_SFLOAT;

		case FMT_CASE(RGBA, UNSIGNED_INT32):				return VK_FORMAT_R32G32B32A32_UINT;
		case FMT_CASE(RGBA, SIGNED_INT32):					return VK_FORMAT_R32G32B32A32_SINT;
		case FMT_CASE(RGBA, FLOAT):							return VK_FORMAT_R32G32B32A32_SFLOAT;

		case FMT_CASE(R, FLOAT64):							return VK_FORMAT_R64_SFLOAT;
		case FMT_CASE(RG, FLOAT64):							return VK_FORMAT_R64G64_SFLOAT;
		case FMT_CASE(RGB, FLOAT64):						return VK_FORMAT_R64G64B64_SFLOAT;
		case FMT_CASE(RGBA, FLOAT64):						return VK_FORMAT_R64G64B64A64_SFLOAT;

		case FMT_CASE(RGB, UNSIGNED_INT_11F_11F_10F_REV):	return VK_FORMAT_B10G11R11_UFLOAT_PACK32;
		case FMT_CASE(RGB, UNSIGNED_INT_999_E5_REV):		return VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;

		case FMT_CASE(BGR, UNORM_INT8):						return VK_FORMAT_B8G8R8_UNORM;
		case FMT_CASE(BGR, SNORM_INT8):						return VK_FORMAT_B8G8R8_SNORM;
		case FMT_CASE(BGR, UNSIGNED_INT8):					return VK_FORMAT_B8G8R8_UINT;
		case FMT_CASE(BGR, SIGNED_INT8):					return VK_FORMAT_B8G8R8_SINT;
		case FMT_CASE(sBGR, UNORM_INT8):					return VK_FORMAT_B8G8R8_SRGB;

		case FMT_CASE(BGRA, UNORM_INT8):					return VK_FORMAT_B8G8R8A8_UNORM;
		case FMT_CASE(BGRA, SNORM_INT8):					return VK_FORMAT_B8G8R8A8_SNORM;
		case FMT_CASE(BGRA, UNSIGNED_INT8):					return VK_FORMAT_B8G8R8A8_UINT;
		case FMT_CASE(BGRA, SIGNED_INT8):					return VK_FORMAT_B8G8R8A8_SINT;
		case FMT_CASE(sBGRA, UNORM_INT8):					return VK_FORMAT_B8G8R8A8_SRGB;

		case FMT_CASE(BGRA, UNORM_INT_1010102_REV):			return VK_FORMAT_A2R10G10B10_UNORM_PACK32;
		case FMT_CASE(BGRA, SNORM_INT_1010102_REV):			return VK_FORMAT_A2R10G10B10_SNORM_PACK32;
		case FMT_CASE(BGRA, UNSIGNED_INT_1010102_REV):		return VK_FORMAT_A2R10G10B10_UINT_PACK32;
		case FMT_CASE(BGRA, SIGNED_INT_1010102_REV):		return VK_FORMAT_A2R10G10B10_SINT_PACK32;

		case FMT_CASE(D, UNORM_INT16):						return VK_FORMAT_D16_UNORM;
		case FMT_CASE(D, UNSIGNED_INT_24_8_REV):			return VK_FORMAT_X8_D24_UNORM_PACK32;
		case FMT_CASE(D, FLOAT):							return VK_FORMAT_D32_SFLOAT;

		case FMT_CASE(S, UNSIGNED_INT8):					return VK_FORMAT_S8_UINT;

		case FMT_CASE(DS, UNSIGNED_INT_16_8_8):				return VK_FORMAT_D16_UNORM_S8_UINT;
		case FMT_CASE(DS, UNSIGNED_INT_24_8_REV):			return VK_FORMAT_D24_UNORM_S8_UINT;
		case FMT_CASE(DS, FLOAT_UNSIGNED_INT_24_8_REV):		return VK_FORMAT_D32_SFLOAT_S8_UINT;

		default:
			TCU_THROW(InternalError, "Unknown texture format");
	}

#undef PACK_FMT
#undef FMT_CASE
}